

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int base64_encode(char *in_bin,int in_len,char *out_base64,int out_len)

{
  int iVar1;
  int iVar2;
  undefined1 local_30 [4];
  int res;
  base64_encodestate state;
  int out_len_local;
  char *out_base64_local;
  int in_len_local;
  char *in_bin_local;
  
  state._4_4_ = out_len;
  unique0x10000063 = out_base64;
  base64_encodestate_init((base64_encodestate *)local_30);
  iVar1 = base64_encode_block(in_bin,in_len,stack0xffffffffffffffe0,state._4_4_,
                              (base64_encodestate *)local_30);
  iVar2 = base64_encode_blockend
                    (stack0xffffffffffffffe0 + iVar1,state._4_4_ - iVar1,
                     (base64_encodestate *)local_30);
  return iVar1 + iVar2;
}

Assistant:

int
base64_encode(const char *in_bin, int in_len,
	      char *out_base64, int out_len)
{
	struct base64_encodestate state;
	base64_encodestate_init(&state);
	int res = base64_encode_block(in_bin, in_len, out_base64,
				      out_len, &state);
	return res + base64_encode_blockend(out_base64 + res, out_len - res,
					    &state);
}